

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.cc
# Opt level: O2

int RaptorCondVarWait(raptor_condvar_t *cv,raptor_mutex_t *mutex,int64_t timeout_ms)

{
  int iVar1;
  ulong uVar2;
  timespec abstime;
  timespec local_40;
  timeval local_30;
  
  if (timeout_ms < 0) {
    iVar1 = pthread_cond_wait((pthread_cond_t *)cv,(pthread_mutex_t *)mutex);
  }
  else {
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    local_40.tv_sec = (ulong)timeout_ms / 1000 + local_30.tv_sec;
    uVar2 = ((ulong)timeout_ms % 1000) * 1000 + local_30.tv_usec;
    if (999999 < (long)uVar2) {
      local_40.tv_sec = local_40.tv_sec + uVar2 / 1000000;
      uVar2 = uVar2 % 1000000;
    }
    local_40.tv_nsec = uVar2 * 1000;
    iVar1 = pthread_cond_timedwait((pthread_cond_t *)cv,(pthread_mutex_t *)mutex,&local_40);
  }
  return (int)(iVar1 == 0x6e);
}

Assistant:

int RaptorCondVarWait(
    raptor_condvar_t* cv, raptor_mutex_t* mutex, int64_t timeout_ms) {
    int error = 0;
    if (timeout_ms < 0) {
        error = pthread_cond_wait(cv, mutex);
    } else {
        struct timeval now;
        gettimeofday(&now, nullptr);
        now.tv_sec += static_cast<time_t>(timeout_ms / 1000);
        now.tv_usec += static_cast<long>((timeout_ms % 1000) * 1000);
        long sec = now.tv_usec / 1000000;
        if (sec > 0) {
            now.tv_sec += sec;
            now.tv_usec -= sec * 1000000;
        }
        struct timespec abstime;
        abstime.tv_sec = now.tv_sec;
        abstime.tv_nsec = now.tv_usec * 1000;
        error = pthread_cond_timedwait(cv, mutex, &abstime);
    }
    return (error == ETIMEDOUT) ? 1 : 0;
}